

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

char * __thiscall testing::internal::FilePath::FindLastPathSeparator(FilePath *this)

{
  char *pcVar1;
  char *last_sep;
  
  pcVar1 = c_str((FilePath *)0x12e983);
  pcVar1 = strrchr(pcVar1,0x2f);
  return pcVar1;
}

Assistant:

const char* FilePath::FindLastPathSeparator() const {
  const char* const last_sep = strrchr(c_str(), kPathSeparator);
#if GTEST_HAS_ALT_PATH_SEP_
  const char* const last_alt_sep = strrchr(c_str(), kAlternatePathSeparator);
  // Comparing two pointers of which only one is NULL is undefined.
  if (last_alt_sep != NULL &&
      (last_sep == NULL || last_alt_sep > last_sep)) {
    return last_alt_sep;
  }
#endif
  return last_sep;
}